

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFAnnotationObjectHelper::getPageContentForAppearance
          (string *__return_storage_ptr__,QPDFAnnotationObjectHelper *this,string *name,int rotate,
          int required_flags,int forbidden_flags)

{
  Rectangle r;
  bool bVar1;
  bool local_55a;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  string local_428;
  QPDFObjectHandle local_408;
  allocator<char> local_3f1;
  string local_3f0;
  undefined1 local_3d0 [8];
  QPDFMatrix AA;
  undefined1 local_370 [8];
  Rectangle T;
  Rectangle bbox;
  double local_328;
  double local_320;
  double local_318;
  Rectangle local_310;
  Rectangle local_2f0;
  double local_2d0;
  double rect_h;
  double rect_w;
  QPDFMatrix mr;
  undefined1 auStack_288 [7];
  bool do_rotate;
  Rectangle rect;
  QPDFMatrix local_238;
  undefined1 auStack_208 [8];
  QPDFMatrix matrix;
  allocator<char> local_1c9;
  uint local_1c8;
  allocator<char> local_1c1;
  int flags;
  undefined1 local_1a0 [8];
  QPDFObjectHandle matrix_obj;
  string local_188 [32];
  undefined1 local_168 [8];
  QPDFObjectHandle bbox_obj;
  string local_150 [39];
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [24];
  QPDFObjectHandle as;
  string local_e0 [32];
  undefined1 local_c0 [24];
  QPDFObjectHandle rect_obj;
  string local_98 [55];
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [28];
  int forbidden_flags_local;
  int required_flags_local;
  int rotate_local;
  string *name_local;
  QPDFAnnotationObjectHelper *this_local;
  
  local_40._20_4_ = forbidden_flags;
  local_40._24_4_ = required_flags;
  forbidden_flags_local = rotate;
  _required_flags_local = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  name_local = (string *)this;
  this_local = (QPDFAnnotationObjectHelper *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/N",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"",
             (allocator<char> *)
             ((long)&rect_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  getAppearanceStream((QPDFAnnotationObjectHelper *)local_40,(string *)this,&local_60);
  bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_40);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rect_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",
               (allocator<char> *)
               ((long)&rect_obj.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rect_obj.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 6));
    return __return_storage_ptr__;
  }
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,"/Rect",
             (allocator<char> *)
             ((long)&as.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_c0 + 0x10),(string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&as.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"/N",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"",
             (allocator<char> *)
             ((long)&bbox_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  getAppearanceStream((QPDFAnnotationObjectHelper *)local_108,(string *)this,&local_128);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_108 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_108);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bbox_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_188,"/BBox",
             (allocator<char> *)
             ((long)&matrix_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_168,(string *)(local_108 + 0x10));
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&matrix_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&flags,"/Matrix",&local_1c1);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1a0,(string *)(local_108 + 0x10));
  std::__cxx11::string::~string((string *)&flags);
  std::allocator<char>::~allocator(&local_1c1);
  local_1c8 = getFlags(this);
  if ((local_1c8 & local_40._20_4_) == 0) {
    if ((local_1c8 & local_40._24_4_) == local_40._24_4_) {
      bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)local_168);
      if ((bVar1) &&
         (bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)(local_c0 + 0x10)), bVar1)) {
        QPDFMatrix::QPDFMatrix((QPDFMatrix *)auStack_208);
        bVar1 = QPDFObjectHandle::isMatrix((QPDFObjectHandle *)local_1a0);
        if (bVar1) {
          QTC::TC("qpdf","QPDFAnnotationObjectHelper explicit matrix",0);
          QPDFObjectHandle::getArrayAsMatrix((Matrix *)&rect.ury,(QPDFObjectHandle *)local_1a0);
          QPDFMatrix::QPDFMatrix(&local_238,(Matrix *)&rect.ury);
          memcpy(auStack_208,&local_238,0x30);
        }
        else {
          QTC::TC("qpdf","QPDFAnnotationObjectHelper default matrix",0);
        }
        QPDFObjectHandle::getArrayAsRectangle
                  ((Rectangle *)auStack_288,(QPDFObjectHandle *)(local_c0 + 0x10));
        bVar1 = (local_1c8 & 0x10) != 0;
        local_55a = forbidden_flags_local != 0 && bVar1;
        mr.f._7_1_ = local_55a;
        if (forbidden_flags_local != 0 && bVar1) {
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)&rect_w);
          QPDFMatrix::rotatex90((QPDFMatrix *)&rect_w,forbidden_flags_local);
          QPDFMatrix::concat((QPDFMatrix *)&rect_w,(QPDFMatrix *)auStack_208);
          matrix.d = mr.d;
          matrix.e = mr.e;
          matrix.b = mr.b;
          matrix.c = mr.c;
          auStack_208 = (undefined1  [8])rect_w;
          matrix.a = mr.a;
          rect_h = rect.lly - _auStack_288;
          local_2d0 = rect.urx - rect.llx;
          if (forbidden_flags_local == 0x5a) {
            QTC::TC("qpdf","QPDFAnnotationObjectHelper rotate 90",0);
            QPDFObjectHandle::Rectangle::Rectangle
                      (&local_2f0,_auStack_288,rect.urx,_auStack_288 + local_2d0,rect.urx + rect_h);
            _auStack_288 = local_2f0.llx;
            rect.llx = local_2f0.lly;
            rect.lly = local_2f0.urx;
            rect.urx = local_2f0.ury;
          }
          else if (forbidden_flags_local == 0xb4) {
            QTC::TC("qpdf","QPDFAnnotationObjectHelper rotate 180",0);
            QPDFObjectHandle::Rectangle::Rectangle
                      (&local_310,_auStack_288 - rect_h,rect.urx,_auStack_288,rect.urx + local_2d0);
            _auStack_288 = local_310.llx;
            rect.llx = local_310.lly;
            rect.lly = local_310.urx;
            rect.urx = local_310.ury;
          }
          else if (forbidden_flags_local == 0x10e) {
            QTC::TC("qpdf","QPDFAnnotationObjectHelper rotate 270",0);
            QPDFObjectHandle::Rectangle::Rectangle
                      ((Rectangle *)&bbox.ury,_auStack_288 - local_2d0,rect.urx - rect_h,
                       _auStack_288,rect.urx);
            _auStack_288 = bbox.ury;
            rect.llx = local_328;
            rect.lly = local_320;
            rect.urx = local_318;
          }
        }
        QPDFObjectHandle::getArrayAsRectangle((Rectangle *)&T.ury,(QPDFObjectHandle *)local_168);
        r.lly = bbox.llx;
        r.llx = T.ury;
        r.urx = bbox.lly;
        r.ury = bbox.urx;
        QPDFMatrix::transformRectangle((Rectangle *)local_370,(QPDFMatrix *)auStack_208,r);
        if ((T.lly != (double)local_370) || (NAN(T.lly) || NAN((double)local_370))) {
          if ((T.urx != T.llx) || (NAN(T.urx) || NAN(T.llx))) {
            QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_3d0);
            QPDFMatrix::translate((QPDFMatrix *)local_3d0,_auStack_288,rect.llx);
            QPDFMatrix::scale((QPDFMatrix *)local_3d0,
                              (rect.lly - _auStack_288) / (T.lly - (double)local_370),
                              (rect.urx - rect.llx) / (T.urx - T.llx));
            QPDFMatrix::translate((QPDFMatrix *)local_3d0,-(double)local_370,-T.llx);
            if ((mr.f._7_1_ & 1) != 0) {
              QPDFMatrix::rotatex90((QPDFMatrix *)local_3d0,forbidden_flags_local);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f0,"/Subtype",&local_3f1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_428,"/Form",&local_429);
            QPDFObjectHandle::newName(&local_408,&local_428);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)(local_108 + 0x10),&local_3f0,&local_408);
            QPDFObjectHandle::~QPDFObjectHandle(&local_408);
            std::__cxx11::string::~string((string *)&local_428);
            std::allocator<char>::~allocator(&local_429);
            std::__cxx11::string::~string((string *)&local_3f0);
            std::allocator<char>::~allocator(&local_3f1);
            QPDFMatrix::unparse_abi_cxx11_(&local_4d0,(QPDFMatrix *)local_3d0);
            std::operator+(&local_4b0,"q\n",&local_4d0);
            std::operator+(&local_490,&local_4b0," cm\n");
            std::operator+(&local_470,&local_490,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           _required_flags_local);
            std::operator+(&local_450,&local_470," Do\n");
            std::operator+(__return_storage_ptr__,&local_450,"Q\n");
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&local_470);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_4d0);
            goto LAB_001bf652;
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&AA.f + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&AA.f + 7));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&matrix.f + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&matrix.f + 6));
      }
    }
    else {
      QTC::TC("qpdf","QPDFAnnotationObjectHelper missing required flags",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&matrix.f + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&matrix.f + 7));
    }
  }
  else {
    QTC::TC("qpdf","QPDFAnnotationObjectHelper forbidden flags",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1c9);
    std::allocator<char>::~allocator(&local_1c9);
  }
LAB_001bf652:
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1a0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_168);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_108 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_c0 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFAnnotationObjectHelper::getPageContentForAppearance(
    std::string const& name, int rotate, int required_flags, int forbidden_flags)
{
    if (!getAppearanceStream("/N").isStream()) {
        return "";
    }

    // The appearance matrix computed by this method is the transformation matrix that needs to be
    // in effect when drawing this annotation's appearance stream on the page. The algorithm for
    // computing the appearance matrix described in section 12.5.5 of the ISO-32000 PDF spec is
    // similar but not identical to what we are doing here.

    // When rendering an appearance stream associated with an annotation, there are four relevant
    // components:
    //
    // * The appearance stream's bounding box (/BBox)
    // * The appearance stream's matrix (/Matrix)
    // * The annotation's rectangle (/Rect)
    // * In the case of form fields with the NoRotate flag, the page's rotation

    // When rendering a form xobject in isolation, just drawn with a /Do operator, there is no form
    // field, so page rotation is not relevant, and there is no annotation, so /Rect is not
    // relevant, so only /BBox and /Matrix are relevant. The effect of these are as follows:

    // * /BBox is treated as a clipping region
    // * /Matrix is applied as a transformation prior to rendering the appearance stream.

    // There is no relationship between /BBox and /Matrix in this case.

    // When rendering a form xobject in the context of an annotation, things are a little different.
    // In particular, a matrix is established such that /BBox, when transformed by /Matrix, would
    // fit completely inside of /Rect. /BBox is no longer a clipping region. To illustrate the
    // difference, consider a /Matrix of [2 0 0 2 0 0], which is scaling by a factor of two along
    // both axes. If the appearance stream drew a rectangle equal to /BBox, in the case of the form
    // xobject in isolation, this matrix would cause only the lower-left quadrant of the rectangle
    // to be visible since the scaling would cause the rest of it to fall outside of the clipping
    // region. In the case of the form xobject displayed in the context of an annotation, such a
    // matrix would have no effect at all because it would be applied to the bounding box first, and
    // then when the resulting enclosing quadrilateral was transformed to fit into /Rect, the effect
    // of the scaling would be undone.

    // Our job is to create a transformation matrix that compensates for these differences so that
    // the appearance stream of an annotation can be drawn as a regular form xobject.

    // To do this, we perform the following steps, which overlap significantly with the algorithm
    // in 12.5.5:

    // 1. Transform the four corners of /BBox by applying /Matrix to them, creating an arbitrarily
    //    transformed quadrilateral.

    // 2. Find the minimum upright rectangle that encompasses the resulting quadrilateral. This is
    //    the "transformed appearance box", T.

    // 3. Compute matrix A that maps the lower left and upper right corners of T to the annotation's
    //    /Rect. This can be done by scaling so that the sizes match and translating so that the
    //    scaled T exactly overlaps /Rect.

    // If the annotation's /F flag has bit 4 set, this means that annotation is to be rotated about
    // its upper left corner to counteract any rotation of the page so it remains upright. To
    // achieve this effect, we do the following extra steps:

    // 1. Perform the rotation on /BBox box prior to transforming it with /Matrix (by replacing
    //    matrix with concatenation of matrix onto the rotation)

    // 2. Rotate the destination rectangle by the specified amount

    // 3. Apply the rotation to A as computed above to get the final appearance matrix.

    QPDFObjectHandle rect_obj = oh().getKey("/Rect");
    QPDFObjectHandle as = getAppearanceStream("/N").getDict();
    QPDFObjectHandle bbox_obj = as.getKey("/BBox");
    QPDFObjectHandle matrix_obj = as.getKey("/Matrix");

    int flags = getFlags();
    if (flags & forbidden_flags) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper forbidden flags");
        return "";
    }
    if ((flags & required_flags) != required_flags) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper missing required flags");
        return "";
    }

    if (!(bbox_obj.isRectangle() && rect_obj.isRectangle())) {
        return "";
    }
    QPDFMatrix matrix;
    if (matrix_obj.isMatrix()) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper explicit matrix");
        matrix = QPDFMatrix(matrix_obj.getArrayAsMatrix());
    } else {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper default matrix");
    }
    QPDFObjectHandle::Rectangle rect = rect_obj.getArrayAsRectangle();
    bool do_rotate = (rotate && (flags & an_no_rotate));
    if (do_rotate) {
        // If the annotation flags include the NoRotate bit and the page is rotated, we have to
        // rotate the annotation about its upper left corner by the same amount in the opposite
        // direction so that it will remain upright in absolute coordinates. Since the semantics of
        // /Rotate for a page are to rotate the page, while the effect of rotating using a
        // transformation matrix is to rotate the coordinate system, the opposite directionality is
        // explicit in the code.
        QPDFMatrix mr;
        mr.rotatex90(rotate);
        mr.concat(matrix);
        matrix = mr;
        double rect_w = rect.urx - rect.llx;
        double rect_h = rect.ury - rect.lly;
        switch (rotate) {
        case 90:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 90");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx, rect.ury, rect.llx + rect_h, rect.ury + rect_w);
            break;
        case 180:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 180");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx - rect_w, rect.ury, rect.llx, rect.ury + rect_h);
            break;
        case 270:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 270");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx - rect_h, rect.ury - rect_w, rect.llx, rect.ury);
            break;
        default:
            // ignore
            break;
        }
    }

    // Transform bounding box by matrix to get T
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = matrix.transformRectangle(bbox);
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return "";
    }
    // Compute a matrix to transform the appearance box to the rectangle
    QPDFMatrix AA;
    AA.translate(rect.llx, rect.lly);
    AA.scale((rect.urx - rect.llx) / (T.urx - T.llx), (rect.ury - rect.lly) / (T.ury - T.lly));
    AA.translate(-T.llx, -T.lly);
    if (do_rotate) {
        AA.rotatex90(rotate);
    }

    as.replaceKey("/Subtype", QPDFObjectHandle::newName("/Form"));
    return ("q\n" + AA.unparse() + " cm\n" + name + " Do\n" + "Q\n");
}